

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
Address_TaprootScriptAddressTest_Test::TestBody(Address_TaprootScriptAddressTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference network_parameter;
  AssertionResult gtest_ar_12;
  CfdException *except;
  Message local_b00;
  NetType local_af8 [2];
  undefined1 local_af0 [8];
  AssertionResult gtest_ar_11;
  Message local_ad8;
  string local_ad0;
  undefined1 local_ab0 [8];
  AssertionResult gtest_ar_10;
  Message local_a98;
  Address local_a90;
  AssertHelper local_918;
  Message local_910;
  NetType local_908 [2];
  undefined1 local_900 [8];
  AssertionResult gtest_ar_9;
  Message local_8e8;
  string local_8e0;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar_8;
  Message local_8a8 [2];
  Address local_898;
  undefined1 local_720 [8];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> formats;
  Message local_700;
  Script local_6f8;
  string local_6c0;
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar_7;
  Message local_688;
  Script local_680;
  string local_648;
  undefined1 local_628 [8];
  AssertionResult gtest_ar_6;
  Message local_610;
  TaprootScriptTree local_608;
  string local_578;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_5;
  Message local_540;
  ByteData local_538;
  string local_520;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_4;
  Message local_4e8;
  WitnessVersion local_4e0 [2];
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_3;
  Message local_4c0;
  AddressType local_4b8 [2];
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_2;
  Message local_498;
  NetType local_490 [2];
  undefined1 local_488 [8];
  AssertionResult gtest_ar_1;
  Message local_470;
  string local_468;
  undefined1 local_448 [8];
  AssertionResult gtest_ar;
  undefined1 local_2c0 [8];
  Address address;
  undefined1 local_110 [8];
  TaprootScriptTree tree;
  ScriptBuilder build;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  SchnorrPubkey pubkey;
  Address_TaprootScriptAddressTest_Test *this_local;
  
  pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
             &local_49);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::ScriptBuilder::ScriptBuilder
            ((ScriptBuilder *)
             &tree.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::AppendOperator
            ((ScriptBuilder *)
             &tree.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build
            ((Script *)&address.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (ScriptBuilder *)
             &tree.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)local_110,
             (Script *)&address.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Script::~Script
            ((Script *)&address.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Address::Address((Address *)local_2c0);
  cfd::core::Address::Address
            ((Address *)&gtest_ar.message_,kCfdSuccess,kVersion1,(TaprootScriptTree *)local_110,
             (SchnorrPubkey *)local_28);
  cfd::core::Address::operator=((Address *)local_2c0,(Address *)&gtest_ar.message_);
  cfd::core::Address::~Address((Address *)&gtest_ar.message_);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_468,(Address *)local_2c0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_448,
             "\"bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah\"",
             "address.GetAddress().c_str()",
             "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah",pcVar2);
  std::__cxx11::string::~string((string *)&local_468);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xe3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  local_490[1] = 0;
  local_490[0] = cfd::core::Address::GetNetType((Address *)local_2c0);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_488,"NetType::kMainnet","address.GetNetType()",local_490 + 1,
             local_490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  local_4b8[1] = 7;
  local_4b8[0] = cfd::core::Address::GetAddressType((Address *)local_2c0);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_4b0,"AddressType::kTaprootAddress","address.GetAddressType()",
             local_4b8 + 1,local_4b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xe5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_4e0[1] = 1;
  local_4e0[0] = cfd::core::Address::GetWitnessVersion((Address *)local_2c0);
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((EqHelper<false> *)local_4d8,"WitnessVersion::kVersion1","address.GetWitnessVersion()",
             local_4e0 + 1,local_4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xe6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  cfd::core::Address::GetHash(&local_538,(Address *)local_2c0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_520,&local_538);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_500,
             "\"88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799\"",
             "address.GetHash().GetHex().c_str()",
             "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799",pcVar2);
  std::__cxx11::string::~string((string *)&local_520);
  cfd::core::ByteData::~ByteData(&local_538);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xe8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  cfd::core::Address::GetScriptTree(&local_608,(Address *)local_2c0);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_578,&local_608.super_TapBranch);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_558,"\"tl(51)\"","address.GetScriptTree().ToString()",
             (char (*) [7])"tl(51)",&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_608);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_610);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_610);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_610);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  cfd::core::Address::GetScript(&local_680,(Address *)local_2c0);
  cfd::core::Script::GetHex_abi_cxx11_(&local_648,&local_680);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_628,"\"\"","address.GetScript().GetHex().c_str()","",pcVar2);
  std::__cxx11::string::~string((string *)&local_648);
  cfd::core::Script::~Script(&local_680);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_628);
  if (!bVar1) {
    testing::Message::Message(&local_688);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_628);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_688);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_688);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_628);
  cfd::core::Address::GetLockingScript(&local_6f8,(Address *)local_2c0);
  cfd::core::Script::GetHex_abi_cxx11_(&local_6c0,&local_6f8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6a0,
             "\"512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799\"",
             "address.GetLockingScript().GetHex().c_str()",
             "512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799",pcVar2);
  std::__cxx11::string::~string((string *)&local_6c0);
  cfd::core::Script::~Script(&local_6f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a0);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &formats.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xed,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &formats.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_700);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &formats.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
  cfd::core::GetBitcoinAddressFormatList();
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      network_parameter =
           std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           ::operator[]((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                         *)local_720,1);
      cfd::core::Address::Address
                (&local_898,kCfdIllegalArgumentError,kVersion1,(TaprootScriptTree *)local_110,
                 (SchnorrPubkey *)local_28,network_parameter);
      cfd::core::Address::operator=((Address *)local_2c0,&local_898);
      cfd::core::Address::~Address(&local_898);
    }
  }
  else {
    testing::Message::Message(local_8a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xf1,
               "Expected: (address = Address(NetType::kTestnet, WitnessVersion::kVersion1, tree, pubkey, formats[1])) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_8a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_8a8);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_8e0,(Address *)local_2c0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_8c0,
             "\"tb1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vs7rjr8c\"",
             "address.GetAddress().c_str()",
             "tb1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vs7rjr8c",pcVar2);
  std::__cxx11::string::~string((string *)&local_8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(&local_8e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xf3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_8e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_8e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  local_908[1] = 1;
  local_908[0] = cfd::core::Address::GetNetType((Address *)local_2c0);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_900,"NetType::kTestnet","address.GetNetType()",local_908 + 1,
             local_908);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_900);
  if (!bVar1) {
    testing::Message::Message(&local_910);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_900);
    testing::internal::AssertHelper::AssertHelper
              (&local_918,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_918,&local_910);
    testing::internal::AssertHelper::~AssertHelper(&local_918);
    testing::Message::~Message(&local_910);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_900);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::Address
                (&local_a90,kCfdIllegalStateError,kVersion1,(TaprootScriptTree *)local_110,
                 (SchnorrPubkey *)local_28,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)local_720);
      cfd::core::Address::operator=((Address *)local_2c0,&local_a90);
      cfd::core::Address::~Address(&local_a90);
    }
  }
  else {
    testing::Message::Message(&local_a98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xf7,
               "Expected: (address = Address(NetType::kRegtest, WitnessVersion::kVersion1, tree, pubkey, formats)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_a98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_a98);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_ad0,(Address *)local_2c0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_ab0,
             "\"bcrt1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsn6c9jz\"",
             "address.GetAddress().c_str()",
             "bcrt1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsn6c9jz",pcVar2);
  std::__cxx11::string::~string((string *)&local_ad0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab0);
  if (!bVar1) {
    testing::Message::Message(&local_ad8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ab0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xf9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_ad8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_ad8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab0);
  local_af8[1] = 2;
  local_af8[0] = cfd::core::Address::GetNetType((Address *)local_2c0);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_af0,"NetType::kRegtest","address.GetNetType()",local_af8 + 1,
             local_af8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af0);
  if (!bVar1) {
    testing::Message::Message(&local_b00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_af0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0xfa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except,&local_b00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except);
    testing::Message::~Message(&local_b00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_af0);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_720);
  cfd::core::Address::~Address((Address *)local_2c0);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)local_110);
  cfd::core::ScriptBuilder::~ScriptBuilder
            ((ScriptBuilder *)
             &tree.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_28);
  return;
}

Assistant:

TEST(Address, TaprootScriptAddressTest) {
  try {
    const SchnorrPubkey pubkey(
        "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
    ScriptBuilder build;
    build.AppendOperator(ScriptOperator::OP_TRUE);
    TaprootScriptTree tree(build.Build());
    Address address;
    address = Address(NetType::kMainnet,
                    WitnessVersion::kVersion1, tree, pubkey);
    EXPECT_STREQ("bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah",
                address.GetAddress().c_str());
    EXPECT_EQ(NetType::kMainnet, address.GetNetType());
    EXPECT_EQ(AddressType::kTaprootAddress, address.GetAddressType());
    EXPECT_EQ(WitnessVersion::kVersion1, address.GetWitnessVersion());
    EXPECT_STREQ("88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799",
                address.GetHash().GetHex().c_str());
    EXPECT_EQ("tl(51)",
              address.GetScriptTree().ToString());
    EXPECT_STREQ("", address.GetScript().GetHex().c_str());
    EXPECT_STREQ("512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799",
        address.GetLockingScript().GetHex().c_str());

    auto formats = cfd::core::GetBitcoinAddressFormatList();
    EXPECT_NO_THROW((address = Address(NetType::kTestnet,
                    WitnessVersion::kVersion1, tree, pubkey, formats[1])));
    EXPECT_STREQ("tb1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vs7rjr8c",
                address.GetAddress().c_str());
    EXPECT_EQ(NetType::kTestnet, address.GetNetType());

    EXPECT_NO_THROW((address = Address(NetType::kRegtest,
                    WitnessVersion::kVersion1, tree, pubkey, formats)));
    EXPECT_STREQ("bcrt1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsn6c9jz",
                address.GetAddress().c_str());
    EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}